

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O2

void DispatchAlphaToGreen_C
               (uint8_t *alpha,int alpha_stride,int width,int height,uint32_t *dst,int dst_stride)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = 0;
  uVar1 = (ulong)(uint)width;
  if (width < 1) {
    uVar1 = 0;
  }
  if (height < 1) {
    height = iVar2;
  }
  for (; iVar2 != height; iVar2 = iVar2 + 1) {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      dst[uVar3] = (uint)alpha[uVar3] << 8;
    }
    alpha = alpha + alpha_stride;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

static void DispatchAlphaToGreen_C(const uint8_t* WEBP_RESTRICT alpha,
                                   int alpha_stride, int width, int height,
                                   uint32_t* WEBP_RESTRICT dst,
                                   int dst_stride) {
  int i, j;
  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      dst[i] = alpha[i] << 8;  // leave A/R/B channels zero'd.
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
}